

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> __thiscall
llbuild::basic::ChecksumOnlyFileSystem::from
          (ChecksumOnlyFileSystem *this,
          unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
          *fs)

{
  unique_ptr<llbuild::basic::ChecksumOnlyFileSystem,_std::default_delete<llbuild::basic::ChecksumOnlyFileSystem>_>
  local_20;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> *local_18
  ;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> *fs_local
  ;
  
  local_18 = fs;
  fs_local = (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)this;
  llvm::
  make_unique<llbuild::basic::ChecksumOnlyFileSystem,std::unique_ptr<llbuild::basic::FileSystem,std::default_delete<llbuild::basic::FileSystem>>>
            ((llvm *)&local_20,fs);
  std::unique_ptr<llbuild::basic::FileSystem,std::default_delete<llbuild::basic::FileSystem>>::
  unique_ptr<llbuild::basic::ChecksumOnlyFileSystem,std::default_delete<llbuild::basic::ChecksumOnlyFileSystem>,void>
            ((unique_ptr<llbuild::basic::FileSystem,std::default_delete<llbuild::basic::FileSystem>>
              *)this,&local_20);
  std::
  unique_ptr<llbuild::basic::ChecksumOnlyFileSystem,_std::default_delete<llbuild::basic::ChecksumOnlyFileSystem>_>
  ::~unique_ptr(&local_20);
  return (__uniq_ptr_data<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>,_true,_true>
          )(__uniq_ptr_data<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FileSystem>
basic::ChecksumOnlyFileSystem::from(std::unique_ptr<FileSystem> fs) {
  return llvm::make_unique<ChecksumOnlyFileSystem>(std::move(fs));
}